

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

void update_monster_region(monst *mon)

{
  boolean bVar1;
  int local_14;
  int i;
  monst *mon_local;
  
  for (local_14 = 0; local_14 < mon->dlevel->n_regions; local_14 = local_14 + 1) {
    bVar1 = inside_region(mon->dlevel->regions[local_14],(int)mon->mx,(int)mon->my);
    if (bVar1 == '\0') {
      bVar1 = mon_in_region(mon->dlevel->regions[local_14],mon);
      if (bVar1 != '\0') {
        remove_mon_from_reg(mon->dlevel->regions[local_14],mon);
      }
    }
    else {
      bVar1 = mon_in_region(mon->dlevel->regions[local_14],mon);
      if (bVar1 == '\0') {
        add_mon_to_reg(mon->dlevel->regions[local_14],mon);
      }
    }
  }
  return;
}

Assistant:

void update_monster_region(struct monst *mon)
{
    int i;

    for (i = 0; i < mon->dlevel->n_regions; i++) {
	if (inside_region(mon->dlevel->regions[i], mon->mx, mon->my)) {
	    if (!mon_in_region(mon->dlevel->regions[i], mon))
		add_mon_to_reg(mon->dlevel->regions[i], mon);
	} else {
	    if (mon_in_region(mon->dlevel->regions[i], mon))
		remove_mon_from_reg(mon->dlevel->regions[i], mon);
	}
    }
}